

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_spot_values.cpp
# Opt level: O2

bool from_issue_266::test_uintwide_t_spot_values_from_issue_266_inc(void)

{
  bool bVar1;
  local_uint128_t inc_value_p;
  local_uint128_t inc_value;
  uintwide_t<128U,_unsigned_int,_void,_false> local_48;
  uintwide_t<128U,_unsigned_int,_void,_false> local_38;
  uintwide_t<128U,_unsigned_int,_void,_false> local_20;
  
  math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_false>::uintwide_t
            (&local_20,"0x0000000000000001FFFFFFFFFFFFFFFF");
  local_48.values.super_array<unsigned_int,_4UL>.elems[0] =
       local_20.values.super_array<unsigned_int,_4UL>.elems[0];
  local_48.values.super_array<unsigned_int,_4UL>.elems[1] =
       local_20.values.super_array<unsigned_int,_4UL>.elems[1];
  local_48.values.super_array<unsigned_int,_4UL>.elems[2] =
       local_20.values.super_array<unsigned_int,_4UL>.elems[2];
  local_48.values.super_array<unsigned_int,_4UL>.elems[3] =
       local_20.values.super_array<unsigned_int,_4UL>.elems[3];
  math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_false>::preincrement(&local_48);
  local_38.values.super_array<unsigned_int,_4UL>.elems[0] =
       local_48.values.super_array<unsigned_int,_4UL>.elems[0];
  local_38.values.super_array<unsigned_int,_4UL>.elems[1] =
       local_48.values.super_array<unsigned_int,_4UL>.elems[1];
  local_38.values.super_array<unsigned_int,_4UL>.elems[2] =
       local_48.values.super_array<unsigned_int,_4UL>.elems[2];
  local_38.values.super_array<unsigned_int,_4UL>.elems[3] =
       local_48.values.super_array<unsigned_int,_4UL>.elems[3];
  bVar1 = math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_false>::operator>
                    (&local_38,&local_20);
  if (bVar1) {
    math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_false>::uintwide_t
              (&local_48,"0x00000000000000020000000000000000");
    bVar1 = math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_false>::operator==
                      (&local_38,&local_48);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

auto test_uintwide_t_spot_values_from_issue_266_inc() -> bool
  {
    // See also: https://github.com/ckormanyos/wide-integer/issues/266

    #if defined(WIDE_INTEGER_NAMESPACE)
    using local_uint128_t = WIDE_INTEGER_NAMESPACE::math::wide_integer::uint128_t;
    #else
    using local_uint128_t = ::math::wide_integer::uint128_t;
    #endif

    local_uint128_t inc_value  ("0x0000000000000001FFFFFFFFFFFFFFFF");
    local_uint128_t inc_value_p(++(local_uint128_t(inc_value)));

    const auto result_is_ok = ((inc_value_p > inc_value) && (inc_value_p == local_uint128_t("0x00000000000000020000000000000000")));

    return result_is_ok;
  }